

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O0

void __thiscall FastLinearExpert<1,_1>::m_step(FastLinearExpert<1,_1> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *this_00;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *this_01;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *this_02;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *other;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *in_RDI;
  ReturnType RVar4;
  double dVar5;
  double dVar6;
  Scalar __x;
  double __y;
  XZ xz;
  X meanX;
  Z meanZ;
  Scal ShNu;
  Scal ShSigma;
  Scal DEN;
  Z SZ;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffbb8;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffbc0;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *in_stack_fffffffffffffbd0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
  *in_stack_fffffffffffffbd8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *in_stack_fffffffffffffbe8;
  DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffbf0;
  StorageBaseType *in_stack_fffffffffffffc00;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffc08;
  
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)0x269ac9);
  dVar6 = *(double *)(in_RDI + 0x40);
  dVar1 = *(double *)(in_RDI + 0x90);
  dVar2 = *(double *)(in_RDI + 0x40);
  dVar3 = *(double *)(in_RDI + 0x88);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator/
            (in_stack_fffffffffffffc08,(double *)in_stack_fffffffffffffc00);
  Eigen::Matrix<double,1,1,0,1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>>
            ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffbc0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
              *)in_stack_fffffffffffffbb8);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator/
            (in_stack_fffffffffffffc08,(double *)in_stack_fffffffffffffc00);
  Eigen::Matrix<double,1,1,0,1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>>
            ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffbc0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
              *)in_stack_fffffffffffffbb8);
  if ((*(double *)(in_RDI + 0x88) != 0.0) || (NAN(*(double *)(in_RDI + 0x88)))) {
    in_stack_fffffffffffffbd8 =
         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
          *)(in_RDI + 0x48);
    Eigen::operator*((double *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator+
              ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffbe8,in_RDI
              );
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const,Eigen::Matrix<double,1,1,0,1,1>const>const>>
    ::operator/((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
                 *)in_stack_fffffffffffffc08,(double *)in_stack_fffffffffffffc00);
    Eigen::Matrix<double,1,1,0,1,1>::operator=
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffbc0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
                *)in_stack_fffffffffffffbb8);
  }
  else {
    Eigen::Matrix<double,_1,_1,_0,_1,_1>::operator=
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffbc0,
               (Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffbb8);
  }
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  Eigen::Matrix<double,1,1,0,1,1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffbc0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>_>
              *)in_stack_fffffffffffffbb8);
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::dot<Eigen::Matrix<double,1,1,0,1,1>>
                    (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  __y = 1.0 / (dVar2 + dVar3);
  dVar5 = RVar4 - __y;
  this_00 = (DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)(in_RDI + 0x198);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator/
            (in_stack_fffffffffffffc08,(double *)in_stack_fffffffffffffc00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::transpose(this_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>>
  ::operator*(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffbe8,
             (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>_>
              *)in_RDI);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,1,0,1,1>>,0>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>_>_>
               *)in_stack_fffffffffffffc08,(double *)in_stack_fffffffffffffc00);
  Eigen::Matrix<double,1,1,0,1,1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffbc0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
              *)this_00);
  this_01 = (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
            ((ulong)*(double *)
                     ((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>_>
                       *)in_RDI + 0x1a0) ^ 0x8000000000000000);
  dVar6 = std::pow(dVar6 + dVar1,__y);
  dVar6 = sqrt((double)this_01 * ((dVar6 / (dVar2 + dVar3)) / dVar5));
  *(double *)
   ((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>_>
     *)in_RDI + 0x148) = dVar6;
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
            (this_01,(MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)this_00);
  Eigen::Matrix<double,1,1,0,1,1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)this_01,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>_>
              *)this_00);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::dot<Eigen::Matrix<double,1,1,0,1,1>>
            (this_01,(MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)this_00);
  this_02 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             *)((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>_>
                 *)in_RDI + 400);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator/
            (in_stack_fffffffffffffc08,(double *)in_stack_fffffffffffffc00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::transpose(this_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>>
  ::operator*(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffbe8,
             (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>_>
              *)in_RDI);
  Eigen::Matrix<double,1,1,0,1,1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)this_01,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>_>_>
              *)this_00);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix
            ((Matrix<double,_1,_1,_0,_1,_1> *)this_01,(Matrix<double,_1,_1,_0,_1,_1> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::transpose(this_00);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
            (this_01,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *)this_00
            );
  Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::noalias
            ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)this_00);
  Eigen::NoAlias<Eigen::Matrix<double,1,1,0,1,1>,Eigen::MatrixBase>::operator-=
            ((NoAlias<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::MatrixBase> *)in_RDI,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Transpose<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>_>
              *)in_stack_fffffffffffffbd8);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
            (this_01,(MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)this_00);
  Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::noalias
            ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)this_00);
  Eigen::NoAlias<Eigen::Matrix<double,1,1,0,1,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::MatrixBase> *)in_RDI,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>_>
              *)in_stack_fffffffffffffbd8);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)this_01,(Matrix<double,_1,_1,_0,_1,_1> *)this_00);
  other = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           *)((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RDI + 0x10);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffbe8,
             (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RDI);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffbd8,other);
  Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::noalias
            ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)this_00);
  Eigen::NoAlias<Eigen::Matrix<double,1,1,0,1,1>,Eigen::MatrixBase>::operator+=
            ((NoAlias<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::MatrixBase> *)in_RDI,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>_>
              *)in_stack_fffffffffffffbd8);
  Eigen::Matrix<double,_1,_1,_0,_1,_1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)this_01,(Matrix<double,_1,_1,_0,_1,_1> *)this_00);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::cwiseProduct<Eigen::Matrix<double,1,1,0,1,1>>
            ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffbe8,
             (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RDI);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::cwiseProduct<Eigen::Matrix<double,1,1,0,1,1>>
            ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffbe8,
             (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_RDI);
  Eigen::
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::rowwise(this_02);
  Eigen::
  VectorwiseOp<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_1>
  ::sum((VectorwiseOp<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_1>
         *)in_stack_fffffffffffffbd8);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::Matrix<double,1,1,0,1,1>const>>
  ::operator+(in_stack_fffffffffffffbe8,
              (MatrixBase<Eigen::PartialReduxExpr<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::internal::member_sum<double,_double>,_1>_>
               *)in_RDI);
  Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::noalias
            ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)this_00);
  Eigen::NoAlias<Eigen::Matrix<double,1,1,0,1,1>,Eigen::MatrixBase>::operator-=
            ((NoAlias<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::MatrixBase> *)in_RDI,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::PartialReduxExpr<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::internal::member_sum<double,_double>,_1>_>_>
              *)in_stack_fffffffffffffbd8);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::operator/=
            (in_stack_fffffffffffffbf0,(Scalar *)in_stack_fffffffffffffbe8);
  Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::cwiseInverse
            ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffbd8);
  Eigen::Matrix<double,1,1,0,1,1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)this_01,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              *)this_00);
  __x = Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::prod
                  ((DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)this_01);
  dVar6 = sqrt(__x);
  *(double *)
   ((MatrixBase<Eigen::PartialReduxExpr<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::internal::member_sum<double,_double>,_1>_>
     *)in_RDI + 0x150) = dVar6;
  ((MatrixBase<Eigen::PartialReduxExpr<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::internal::member_sum<double,_double>,_1>_>
    *)in_RDI)[0xa0] =
       (MatrixBase<Eigen::PartialReduxExpr<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::internal::member_sum<double,_double>,_1>_>
        )0x1;
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
void FAST_LINEAR_EXPERT_base::m_step()
{
	Z SZ;
	Scal DEN;
	Scal ShSigma = Sh + wSigma, ShNu = Sh + wNu;
    Z meanZ = Sz / Sh;
    X meanX = Sx / Sh;

    if( wNu == 0.0 )
        Nu = meanZ;
    else
        Nu = (Sz + wNu*Nu0) / ShNu;

	// Using Moore-Penrose Rank-1 downdate
	SZ = invSzz0 * Nu;
	DEN = Nu.dot(SZ) - 1.0/ShNu;
	invSigma = (invSzz0 - (SZ/DEN) * SZ.transpose()) * ShSigma;
	// Using Determinant Rank-1 downdate
	sqrtDetInvSigma = sqrt( -detInvSzz0 * ( pow(ShSigma,d) / ShNu / DEN) );


	// Using Moore-Penrose Rank-1 update
	SZ = invSzz * Sz;
	DEN = Sz.dot(SZ) - Sh;
	varLambda = invSzz - (SZ/DEN) * SZ.transpose();

    XZ xz = Sxz;
    xz.noalias() -= meanX*Sz.transpose();
    Lambda.noalias() = xz * varLambda;
    Mu = meanX;
    Mu.noalias() += Lambda * (Nu - meanZ);

    Psi = Sxx;
//Psi += wPsi * mixture->getPsi();
    Psi.noalias() -= meanX.cwiseProduct(Sx) + xz.cwiseProduct(Lambda).rowwise().sum();
    Psi /= (wPsi + Sh + 2.0 );
    invPsi = Psi.cwiseInverse();
    sqrtDetInvPsi = sqrt(invPsi.prod());

    recompute = true;
}